

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

int cmsysProcess_SetPipeFile(cmsysProcess *cp,int prPipe,char *file)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  if (cp != (cmsysProcess *)0x0) {
    uVar1 = prPipe - 1;
    if (uVar1 < 3) {
      uVar4 = (ulong)uVar1;
      if (*(void **)(cp->PipeNativeSTDIN + uVar4 * 2 + -9) != (void *)0x0) {
        free(*(void **)(cp->PipeNativeSTDIN + uVar4 * 2 + -9));
        (cp->PipeNativeSTDIN + uVar4 * 2 + -9)[0] = 0;
        (cp->PipeNativeSTDIN + uVar4 * 2 + -9)[1] = 0;
      }
      if (file == (char *)0x0) {
        iVar3 = 1;
      }
      else {
        pcVar2 = strdup(file);
        *(char **)(cp->PipeNativeSTDIN + uVar4 * 2 + -9) = pcVar2;
        iVar3 = 0;
        if (pcVar2 != (char *)0x0) {
          (cp->PipeNativeSTDIN + (ulong)uVar1 * 2)[0] = -1;
          (cp->PipeNativeSTDIN + (ulong)uVar1 * 2)[1] = -1;
          cmsysProcess_SetPipeShared(cp,prPipe,0);
          iVar3 = 1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int kwsysProcess_SetPipeFile(kwsysProcess* cp, int prPipe, const char* file)
{
  char** pfile;
  if (!cp) {
    return 0;
  }
  switch (prPipe) {
    case kwsysProcess_Pipe_STDIN:
      pfile = &cp->PipeFileSTDIN;
      break;
    case kwsysProcess_Pipe_STDOUT:
      pfile = &cp->PipeFileSTDOUT;
      break;
    case kwsysProcess_Pipe_STDERR:
      pfile = &cp->PipeFileSTDERR;
      break;
    default:
      return 0;
  }
  if (*pfile) {
    free(*pfile);
    *pfile = 0;
  }
  if (file) {
    *pfile = strdup(file);
    if (!*pfile) {
      return 0;
    }
  }

  /* If we are redirecting the pipe, do not share it or use a native
     pipe.  */
  if (*pfile) {
    kwsysProcess_SetPipeNative(cp, prPipe, 0);
    kwsysProcess_SetPipeShared(cp, prPipe, 0);
  }
  return 1;
}